

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O3

K __thiscall
snmalloc::
RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
::remove_min(RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
             *this)

{
  long lVar1;
  size_t sVar2;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *pFVar3;
  bool *pbVar4;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *pFVar5;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *pFVar6;
  undefined8 uStack_818;
  RBPath local_810;
  
  pFVar5 = (this->root).unsafe_capptr;
  if (pFVar5 < (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)0x2) {
    pFVar5 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)0x0;
  }
  else {
    lVar1 = 8;
    do {
      *(undefined8 *)((long)&uStack_818 + lVar1) = 0;
      *(undefined1 *)((long)&local_810.path._M_elems[0].node.ptr.val + lVar1) = 0;
      lVar1 = lVar1 + 0x10;
    } while (lVar1 != 0x808);
    local_810.path._M_elems[0].dir = false;
    pFVar5 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)((ulong)pFVar5 & 0xfffffffffffffffe);
    pFVar3 = (pFVar5->left).unsafe_capptr;
    sVar2 = 1;
    if ((FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
         *)0x1 < pFVar3) {
      pbVar4 = &local_810.path._M_elems[1].dir;
      do {
        pFVar6 = pFVar5;
        (((RBStep *)(pbVar4 + -8))->node).ptr.val = (uintptr_t *)pFVar6;
        *pbVar4 = true;
        sVar2 = sVar2 + 1;
        pFVar5 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                  *)((ulong)pFVar3 & 0xfffffffffffffffe);
        pFVar3 = (pFVar5->left).unsafe_capptr;
        pbVar4 = pbVar4 + 0x10;
      } while ((FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)0x1 < pFVar3);
      pFVar5 = (pFVar6->left).unsafe_capptr & 0xfffffffffffffffe;
    }
    local_810.path._M_elems[0].node.ptr.val = (H)(H)this;
    local_810.length = sVar2;
    remove_path(this,&local_810);
  }
  return (K)pFVar5;
}

Assistant:

bool move_inc_null(bool direction)
      {
        auto next = get_dir(direction, curr());
        path[length].set(next, direction);
        length++;
        return !(next.is_null());
      }